

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<signed_char,_signed_char>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<signed_char,_signed_char> *this)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  unsigned_long uVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  bool bVar10;
  byte bVar11;
  
  bVar10 = true;
  if (this->compression_buffer_idx != 0) {
    if (((this->all_invalid == false) && (this->maximum != this->minimum)) ||
       (1 < (byte)(this->mode - AUTO))) {
      pcVar2 = &this->min_max_diff;
      bVar3 = TrySubtractOperator::Operation<signed_char,signed_char,signed_char>
                        (this->maximum,this->minimum,pcVar2);
      this->can_do_for = bVar3;
      CalculateDeltaStats(this);
      if (this->can_do_delta == true) {
        cVar1 = this->minimum_delta;
        if ((this->maximum_delta == cVar1) && ((this->mode & ~AUTO) != DELTA_FOR)) {
          this->total_size = this->total_size + 6;
          return true;
        }
        if (this->min_max_delta_diff == 0) {
          bVar11 = 0;
        }
        else {
          bVar6 = 0;
          bVar11 = this->min_max_delta_diff;
          do {
            bVar6 = bVar6 + 1;
            bVar3 = 1 < bVar11;
            bVar11 = (char)bVar11 >> 1;
          } while (bVar3);
          bVar11 = 8;
          if (bVar6 < 8) {
            bVar11 = bVar6;
          }
        }
        bVar6 = *pcVar2;
        if (bVar6 == 0) {
          bVar8 = 0;
        }
        else {
          bVar8 = 8;
          if (bVar6 != 0x80) {
            bVar7 = 1;
            bVar6 = (bVar6 ^ (char)bVar6 >> 7) - ((char)bVar6 >> 7);
            do {
              bVar7 = bVar7 + 1;
              bVar3 = 1 < bVar6;
              bVar6 = (char)bVar6 >> 1;
            } while (bVar3);
            bVar8 = 8;
            if (bVar7 < 8) {
              bVar8 = bVar7;
            }
          }
        }
        bVar3 = this->mode != FOR;
        if (bVar3 && bVar11 < bVar8) {
          if (this->compression_buffer_idx != 0) {
            uVar5 = 0;
            do {
              this->delta_buffer[uVar5] = this->delta_buffer[uVar5] - cVar1;
              uVar5 = uVar5 + 1;
            } while (uVar5 < this->compression_buffer_idx);
          }
          this->total_size = this->total_size + 10;
          uVar5 = this->compression_buffer_idx;
          if ((uVar5 & 0x1f) != 0) {
            uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar5 & 0x1f);
            uVar5 = (uVar5 - uVar4) + 0x20;
          }
          this->total_size = this->total_size + (bVar11 * uVar5 >> 3);
          if (bVar3 && bVar11 < bVar8) {
            return true;
          }
        }
      }
      if (this->can_do_for == true) {
        if (*pcVar2 == 0) {
          uVar5 = 0;
        }
        else {
          bVar6 = 0;
          bVar11 = *pcVar2;
          do {
            bVar6 = bVar6 + 1;
            bVar3 = 1 < bVar11;
            bVar11 = (char)bVar11 >> 1;
          } while (bVar3);
          bVar11 = 8;
          if (bVar6 < 8) {
            bVar11 = bVar6;
          }
          uVar5 = (ulong)bVar11;
        }
        if (this->compression_buffer_idx != 0) {
          pcVar2 = this->compression_buffer;
          cVar1 = this->minimum;
          uVar9 = 0;
          do {
            pcVar2[uVar9] = pcVar2[uVar9] - cVar1;
            uVar9 = uVar9 + 1;
          } while (uVar9 < this->compression_buffer_idx);
        }
        uVar9 = this->compression_buffer_idx;
        if ((uVar9 & 0x1f) != 0) {
          uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar9 & 0x1f);
          uVar9 = (uVar9 - uVar4) + 0x20;
        }
        this->total_size = this->total_size + (uVar9 * uVar5 >> 3) + 9;
      }
      else {
        bVar10 = false;
      }
    }
    else {
      this->total_size = this->total_size + 5;
    }
  }
  return bVar10;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}